

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerHLSL::is_hlsl_force_storage_buffer_as_uav(CompilerHLSL *this,ID id)

{
  _Node_iterator_base<spirv_cross::SetBindingPair,_true> local_40;
  key_type local_38;
  _Node_iterator_base<spirv_cross::SetBindingPair,_true> local_30;
  uint32_t local_28;
  uint32_t local_24;
  uint32_t local_20;
  uint32_t binding;
  CompilerHLSL *pCStack_18;
  uint32_t desc_set;
  CompilerHLSL *this_local;
  ID id_local;
  
  if (((this->hlsl_options).force_storage_buffer_as_uav & 1U) == 0) {
    local_20 = id.id;
    pCStack_18 = this;
    this_local._0_4_ = id.id;
    binding = Compiler::get_decoration((Compiler *)this,id,DecorationDescriptorSet);
    local_28 = this_local._0_4_;
    local_38.binding = Compiler::get_decoration((Compiler *)this,this_local._0_4_,Binding);
    local_38.desc_set = binding;
    local_24 = local_38.binding;
    local_30._M_cur =
         (__node_type *)
         ::std::
         unordered_set<spirv_cross::SetBindingPair,_spirv_cross::InternalHasher,_std::equal_to<spirv_cross::SetBindingPair>,_std::allocator<spirv_cross::SetBindingPair>_>
         ::find(&this->force_uav_buffer_bindings,&local_38);
    local_40._M_cur =
         (__node_type *)
         ::std::
         unordered_set<spirv_cross::SetBindingPair,_spirv_cross::InternalHasher,_std::equal_to<spirv_cross::SetBindingPair>,_std::allocator<spirv_cross::SetBindingPair>_>
         ::end(&this->force_uav_buffer_bindings);
    this_local._7_1_ = ::std::__detail::operator!=(&local_30,&local_40);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerHLSL::is_hlsl_force_storage_buffer_as_uav(ID id) const
{
	if (hlsl_options.force_storage_buffer_as_uav)
	{
		return true;
	}

	const uint32_t desc_set = get_decoration(id, spv::DecorationDescriptorSet);
	const uint32_t binding = get_decoration(id, spv::DecorationBinding);

	return (force_uav_buffer_bindings.find({ desc_set, binding }) != force_uav_buffer_bindings.end());
}